

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

char * osc::FindStr4End(char *p,char *end)

{
  bool bVar1;
  char *end_local;
  char *p_local;
  
  if (p < end) {
    if (*p == '\0') {
      p_local = p + 4;
    }
    else {
      end_local = p + 3;
      while( true ) {
        bVar1 = false;
        if (end_local < end + -1) {
          bVar1 = *end_local != '\0';
        }
        if (!bVar1) break;
        end_local = end_local + 4;
      }
      if (*end_local == '\0') {
        p_local = end_local + 1;
      }
      else {
        p_local = (char *)0x0;
      }
    }
  }
  else {
    p_local = (char *)0x0;
  }
  return p_local;
}

Assistant:

static inline const char* FindStr4End( const char *p, const char *end )
{
    if( p >= end )
        return 0;

	if( p[0] == '\0' )    // special case for SuperCollider integer address pattern
		return p + 4;

    p += 3;
    end -= 1;

    while( p < end && *p )
        p += 4;

    if( *p )
        return 0;
    else
        return p + 1;
}